

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall BuildWithDepsLogTestStraightforward::Run(BuildWithDepsLogTestStraightforward *this)

{
  BuildConfig *config;
  VirtualFileSystem *this_00;
  int *piVar1;
  int iVar2;
  long lVar3;
  Test *pTVar4;
  unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  LoadStatus LVar9;
  Node *pNVar10;
  TimeStamp TVar11;
  string err;
  DepsLog deps_log;
  Builder builder;
  State state;
  allocator<char> local_2e2;
  allocator<char> local_2e1;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  BuildConfig *local_280;
  FakeCommandRunner *local_278;
  undefined1 local_270 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  pointer local_240;
  pointer ppNStack_238;
  pointer local_230;
  pointer ppDStack_228;
  pointer local_220;
  pointer ppDStack_218;
  Builder local_210;
  State local_138;
  
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  local_2c0._M_string_length = 0;
  local_2c0.field_2._M_local_buf[0] = '\0';
  State::State(&local_138);
  iVar2 = g_current_test->assertion_failures_;
  StateTestWithBuiltinRules::AddCatRule((StateTestWithBuiltinRules *)this,&local_138);
  iVar8 = g_current_test->assertion_failures_;
  if (iVar2 == iVar8) {
    AssertParse(&local_138,"build out: cat in1\n  deps = gcc\n  depfile = in1.d\n",
                (ManifestParserOptions)0x0);
    pTVar4 = g_current_test;
    iVar8 = g_current_test->assertion_failures_;
    if (iVar2 != iVar8) goto LAB_0012b990;
    local_270[0] = (string)0x0;
    local_270._8_8_ = (FILE *)0x0;
    local_270._24_8_ = 0;
    local_250._M_local_buf[0] = '\0';
    local_240 = (pointer)0x0;
    ppNStack_238 = (pointer)0x0;
    local_230 = (pointer)0x0;
    ppDStack_228 = (pointer)0x0;
    local_220 = (pointer)0x0;
    ppDStack_218 = (pointer)0x0;
    local_270._16_8_ = &local_250;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"ninja_deps",(allocator<char> *)&local_2e0);
    bVar6 = DepsLog::OpenForWrite((DepsLog *)local_270,(string *)&local_210,&local_2c0);
    bVar6 = testing::Test::Check
                      (pTVar4,bVar6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x849,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
    std::__cxx11::string::~string((string *)&local_210);
    pTVar4 = g_current_test;
    if (bVar6) {
      bVar6 = std::operator==("",&local_2c0);
      bVar6 = testing::Test::Check
                        (pTVar4,bVar6,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x84a,"\"\" == err");
      if (!bVar6) goto LAB_0012b99f;
      config = &(this->super_BuildWithDepsLogTest).super_BuildTest.config_;
      this_00 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_;
      Builder::Builder(&local_210,&local_138,config,(BuildLog *)0x0,(DepsLog *)local_270,
                       &this_00->super_DiskInterface);
      local_278 = &(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_;
      uVar5._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
           (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)
           (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)local_278
      ;
      if (local_210.command_runner_._M_t.
          super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
          super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
          super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0) {
        lVar3 = *(long *)local_210.command_runner_._M_t.
                         super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>
                         .super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
        local_210.command_runner_._M_t.
        super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
        super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
        super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
             (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)
             (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)
             local_278;
        (**(code **)(lVar3 + 8))();
        uVar5._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
        super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
        super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
             local_210.command_runner_._M_t.
             super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
             super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
             super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
      }
      local_210.command_runner_._M_t.
      super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
           uVar5._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t
           .super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
           super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
      pTVar4 = g_current_test;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e0,"out",(allocator<char> *)&local_2a0);
      local_280 = config;
      pNVar10 = Builder::AddTarget(&local_210,&local_2e0,&local_2c0);
      testing::Test::Check
                (pTVar4,pNVar10 != (Node *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x84e,"builder.AddTarget(\"out\", &err)");
      std::__cxx11::string::~string((string *)&local_2e0);
      pTVar4 = g_current_test;
      bVar6 = std::operator==("",&local_2c0);
      bVar6 = testing::Test::Check
                        (pTVar4,bVar6,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x84f,"\"\" == err");
      if (bVar6) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"in1.d",&local_2e1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a0,"out: in2",&local_2e2);
        VirtualFileSystem::Create(this_00,&local_2e0,&local_2a0);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::string::~string((string *)&local_2e0);
        pTVar4 = g_current_test;
        bVar7 = Builder::Build(&local_210,&local_2c0);
        testing::Test::Check
                  (pTVar4,bVar7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                   ,0x851,"builder.Build(&err)");
        pTVar4 = g_current_test;
        bVar7 = std::operator==("",&local_2c0);
        testing::Test::Check
                  (pTVar4,bVar7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                   ,0x852,"\"\" == err");
        pTVar4 = g_current_test;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2e0,"in1.d",(allocator<char> *)&local_2a0);
        TVar11 = VirtualFileSystem::Stat(this_00,&local_2e0,&local_2c0);
        testing::Test::Check
                  (pTVar4,TVar11 == 0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                   ,0x855,"0 == fs_.Stat(\"in1.d\", &err)");
        std::__cxx11::string::~string((string *)&local_2e0);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"in1.d",&local_2e1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a0,"out: in2",&local_2e2);
        VirtualFileSystem::Create(this_00,&local_2e0,&local_2a0);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::string::~string((string *)&local_2e0);
        DepsLog::Close((DepsLog *)local_270);
        local_210.command_runner_._M_t.
        super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
        super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
        super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
             (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)
             (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0;
      }
      else {
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      }
      Builder::~Builder(&local_210);
      DepsLog::~DepsLog((DepsLog *)local_270);
      State::~State(&local_138);
      if (!bVar6) goto LAB_0012b9ba;
      State::State(&local_138);
      iVar2 = g_current_test->assertion_failures_;
      StateTestWithBuiltinRules::AddCatRule((StateTestWithBuiltinRules *)this,&local_138);
      iVar8 = g_current_test->assertion_failures_;
      if (iVar2 == iVar8) {
        AssertParse(&local_138,"build out: cat in1\n  deps = gcc\n  depfile = in1.d\n",
                    (ManifestParserOptions)0x0);
        iVar8 = g_current_test->assertion_failures_;
        if (iVar2 != iVar8) goto LAB_0012bd64;
        piVar1 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_.now_;
        *piVar1 = *piVar1 + 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_210,"in2",(allocator<char> *)&local_2e0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_270,"",(allocator<char> *)&local_2a0);
        VirtualFileSystem::Create(this_00,(string *)&local_210,(string *)local_270);
        std::__cxx11::string::~string((string *)local_270);
        std::__cxx11::string::~string((string *)&local_210);
        pTVar4 = g_current_test;
        local_270[0] = (string)0x0;
        local_270._8_8_ = (FILE *)0x0;
        local_270._24_8_ = 0;
        local_250._M_local_buf[0] = '\0';
        local_240 = (pointer)0x0;
        ppNStack_238 = (pointer)0x0;
        local_230 = (pointer)0x0;
        ppDStack_228 = (pointer)0x0;
        local_220 = (pointer)0x0;
        ppDStack_218 = (pointer)0x0;
        local_270._16_8_ = &local_250;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_210,"ninja_deps",(allocator<char> *)&local_2e0);
        LVar9 = DepsLog::Load((DepsLog *)local_270,(string *)&local_210,&local_138,&local_2c0);
        bVar6 = testing::Test::Check
                          (pTVar4,LVar9 != LOAD_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x867,"deps_log.Load(\"ninja_deps\", &state, &err)");
        std::__cxx11::string::~string((string *)&local_210);
        pTVar4 = g_current_test;
        if (bVar6) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_210,"ninja_deps",(allocator<char> *)&local_2e0);
          bVar6 = DepsLog::OpenForWrite((DepsLog *)local_270,(string *)&local_210,&local_2c0);
          bVar6 = testing::Test::Check
                            (pTVar4,bVar6,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                             ,0x868,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
          std::__cxx11::string::~string((string *)&local_210);
          if (bVar6) {
            Builder::Builder(&local_210,&local_138,local_280,(BuildLog *)0x0,(DepsLog *)local_270,
                             &this_00->super_DiskInterface);
            uVar5._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>.
            _M_t.super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
            super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                 local_210.command_runner_._M_t.
                 super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                 super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                 super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
            local_210.command_runner_._M_t.
            super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
            super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
            super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                 (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)
                 (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)
                 local_278;
            if (uVar5._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>
                ._M_t.super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0) {
              (**(code **)(*(long *)uVar5._M_t.
                                    super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>
                                    .super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl + 8)
              )();
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear(&(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                     commands_ran_);
            pTVar4 = g_current_test;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2e0,"out",(allocator<char> *)&local_2a0);
            pNVar10 = Builder::AddTarget(&local_210,&local_2e0,&local_2c0);
            testing::Test::Check
                      (pTVar4,pNVar10 != (Node *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x86d,"builder.AddTarget(\"out\", &err)");
            std::__cxx11::string::~string((string *)&local_2e0);
            pTVar4 = g_current_test;
            bVar6 = std::operator==("",&local_2c0);
            bVar6 = testing::Test::Check
                              (pTVar4,bVar6,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                               ,0x86e,"\"\" == err");
            pTVar4 = g_current_test;
            if (bVar6) {
              bVar6 = Builder::Build(&local_210,&local_2c0);
              testing::Test::Check
                        (pTVar4,bVar6,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x86f,"builder.Build(&err)");
              pTVar4 = g_current_test;
              bVar6 = std::operator==("",&local_2c0);
              testing::Test::Check
                        (pTVar4,bVar6,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x870,"\"\" == err");
              testing::Test::Check
                        (g_current_test,
                         (long)*(pointer *)
                                ((long)&(this->super_BuildWithDepsLogTest).super_BuildTest.
                                        command_runner_.commands_ran_.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data + 8) -
                         (long)(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                               commands_ran_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start == 0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x874,"1u == command_runner_.commands_ran_.size()");
              local_210.command_runner_._M_t.
              super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
              super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
              super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                   (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)
                   (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0;
            }
            else {
              g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
            }
            Builder::~Builder(&local_210);
          }
          else {
            g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
          }
        }
        else {
          g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        }
        goto LAB_0012b9a3;
      }
LAB_0012bd64:
      g_current_test->assertion_failures_ = iVar8 + 1;
    }
    else {
LAB_0012b99f:
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_0012b9a3:
      DepsLog::~DepsLog((DepsLog *)local_270);
    }
  }
  else {
LAB_0012b990:
    g_current_test->assertion_failures_ = iVar8 + 1;
  }
  State::~State(&local_138);
LAB_0012b9ba:
  std::__cxx11::string::~string((string *)&local_2c0);
  return;
}

Assistant:

TEST_F(BuildWithDepsLogTest, Straightforward) {
  string err;
  // Note: in1 was created by the superclass SetUp().
  const char* manifest =
      "build out: cat in1\n"
      "  deps = gcc\n"
      "  depfile = in1.d\n";
  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AddCatRule(&state));
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    // Run the build once, everything should be ok.
    DepsLog deps_log;
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, NULL, &deps_log, &fs_);
    builder.command_runner_.reset(&command_runner_);
    EXPECT_TRUE(builder.AddTarget("out", &err));
    ASSERT_EQ("", err);
    fs_.Create("in1.d", "out: in2");
    EXPECT_TRUE(builder.Build(&err));
    EXPECT_EQ("", err);

    // The deps file should have been removed.
    EXPECT_EQ(0, fs_.Stat("in1.d", &err));
    // Recreate it for the next step.
    fs_.Create("in1.d", "out: in2");
    deps_log.Close();
    builder.command_runner_.release();
  }

  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AddCatRule(&state));
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    // Touch the file only mentioned in the deps.
    fs_.Tick();
    fs_.Create("in2", "");

    // Run the build again.
    DepsLog deps_log;
    ASSERT_TRUE(deps_log.Load("ninja_deps", &state, &err));
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));

    Builder builder(&state, config_, NULL, &deps_log, &fs_);
    builder.command_runner_.reset(&command_runner_);
    command_runner_.commands_ran_.clear();
    EXPECT_TRUE(builder.AddTarget("out", &err));
    ASSERT_EQ("", err);
    EXPECT_TRUE(builder.Build(&err));
    EXPECT_EQ("", err);

    // We should have rebuilt the output due to in2 being
    // out of date.
    EXPECT_EQ(1u, command_runner_.commands_ran_.size());

    builder.command_runner_.release();
  }
}